

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O0

void __thiscall
TPZSBMatrix<std::complex<double>_>::AutoFill
          (TPZSBMatrix<std::complex<double>_> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  complex<double> a;
  complex<double> a_00;
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  int64_t iVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  double __x;
  double dVar6;
  double __x_00;
  double __x_01;
  double dVar7;
  TPZMatrix<std::complex<double>_> *pTVar8;
  undefined8 uVar9;
  int64_t jmax;
  complex<double> sum;
  complex<double> val;
  int64_t j;
  int64_t i;
  size_t in_stack_000002c8;
  char *in_stack_000002d0;
  complex<double> *in_stack_fffffffffffffea8;
  long in_stack_fffffffffffffeb8;
  long in_stack_fffffffffffffec0;
  complex<double> local_108 [2];
  double local_e8;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffff20;
  complex<double> local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  double local_a8;
  TPZMatrix<std::complex<double>_> *local_a0;
  double local_98;
  TPZMatrix<std::complex<double>_> *local_90;
  TPZMatrix<std::complex<double>_> *local_80;
  TPZMatrix<std::complex<double>_> *local_70;
  TPZMatrix<std::complex<double>_> *local_60;
  long local_58;
  double local_50;
  TPZMatrix<std::complex<double>_> *local_48;
  undefined1 local_40 [16];
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((in_RSI != in_RDX) || (in_ECX == 0)) {
    pzinternal::DebugStopImpl(in_stack_000002d0,in_stack_000002c8);
  }
  in_RDI[2].super_TPZSavable._vptr_TPZSavable = (_func_int **)(local_10 / 10);
  if (in_RDI[2].super_TPZSavable._vptr_TPZSavable == (_func_int **)0x0) {
    in_RDI[2].super_TPZSavable._vptr_TPZSavable = (_func_int **)(local_10 + -1);
  }
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,local_10,local_18);
  std::complex<double>::complex((complex<double> *)local_40,0.0,0.0);
  pTVar8 = (TPZMatrix<std::complex<double>_> *)0x0;
  std::complex<double>::complex((complex<double> *)&local_50,0.0,0.0);
  for (local_28 = 0; lVar4 = local_28, iVar3 = TPZBaseMatrix::Rows(in_RDI), lVar4 < iVar3;
      local_28 = local_28 + 1) {
    std::complex<double>::operator=((complex<double> *)&local_50,0.0);
    lVar4 = (long)in_RDI[2].super_TPZSavable._vptr_TPZSavable + local_28 + 1;
    local_58 = lVar4;
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 <= lVar4) {
      local_58 = TPZBaseMatrix::Rows(in_RDI);
    }
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
      local_60 = pTVar8;
      dVar6 = fabs(__x);
      std::complex<double>::operator+=((complex<double> *)&local_50,dVar6);
    }
    for (local_30 = local_28; local_30 < local_58; local_30 = local_30 + 1) {
      TPZMatrix<std::complex<double>_>::GetRandomVal(in_stack_ffffffffffffff20);
      local_70 = pTVar8;
      local_40._0_8_ = __x_00;
      local_40._8_8_ = pTVar8;
      if (local_30 == local_28) {
        local_80 = pTVar8;
        dVar6 = fabs(__x_00);
        std::complex<double>::operator=((complex<double> *)local_40,dVar6);
      }
      iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                        (in_RDI,local_28,local_30,local_40);
      if (iVar2 == 0) {
        std::operator<<((ostream *)&std::cout,"AutoFill (TPZMatrix) failed.");
        pzinternal::DebugStopImpl(in_stack_000002d0,in_stack_000002c8);
      }
      if (local_28 != local_30) {
        local_98 = (double)local_40._0_8_;
        local_90 = (TPZMatrix<std::complex<double>_> *)local_40._8_8_;
        pTVar8 = (TPZMatrix<std::complex<double>_> *)local_40._8_8_;
        dVar6 = fabs((double)local_40._0_8_);
        std::complex<double>::operator+=((complex<double> *)&local_50,dVar6);
      }
    }
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar3 == iVar5) {
      local_a8 = local_50;
      local_a0 = local_48;
      dVar6 = fabs(local_50);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      dVar7 = fabs(__x_01);
      lVar4 = local_28;
      if (dVar7 < dVar6) {
        uVar9 = 0;
        in_stack_fffffffffffffec0 = local_28;
        std::complex<double>::complex(&local_d8,1.0,0.0);
        std::operator+(in_stack_fffffffffffffea8,(complex<double> *)0x13d8c11);
        local_c0 = uVar9;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffec0,lVar4,local_c8);
      }
      local_e8 = local_50;
      a._M_value._8_8_ = in_stack_fffffffffffffec0;
      a._M_value._0_8_ = in_stack_fffffffffffffeb8;
      pTVar8 = local_48;
      in_stack_ffffffffffffff20 = local_48;
      bVar1 = IsZero(a);
      if (bVar1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        a_00._M_value._8_8_ = in_stack_fffffffffffffec0;
        a_00._M_value._0_8_ = in_stack_fffffffffffffeb8;
        bVar1 = IsZero(a_00);
        lVar4 = local_28;
        if (bVar1) {
          pTVar8 = (TPZMatrix<std::complex<double>_> *)0x0;
          in_stack_fffffffffffffeb8 = local_28;
          std::complex<double>::complex(local_108,1.0,0.0);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,lVar4,in_stack_fffffffffffffeb8,local_108);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZSBMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    if (nrow != ncol || symmetric == 0) {
        DebugStop();
    }
    fBand = nrow/10;
    if (fBand == 0) {
        fBand = nrow-1;
    }
    Resize(nrow, ncol);
    
    int64_t i, j;
    TVar val = 0, sum;
    /** Fill data */
    for(i=0;i<this->Rows();i++) {
        sum = 0.0;
        int64_t jmax = i+fBand+1;
        if (jmax >= this->Rows()) {
            jmax = this->Rows();
        }
        for (j=0; j<i; j++) {
            sum += fabs(GetVal(i, j));
        }
        for(j=i;j<jmax;j++) {
            val = this->GetRandomVal();
            if constexpr (is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(!PutVal(i,j,val))
            {
                std::cout << "AutoFill (TPZMatrix) failed.";
                DebugStop();
            }
            if(i!=j) sum += fabs(val);
        }
        if (this->Rows() == this->Cols()) {
            /** Making diagonally dominant and non zero in diagonal */
            if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
                PutVal(i,i,sum+(TVar)1.);
            // To sure diagonal is not zero.
            if(IsZero(sum) && IsZero(GetVal(i,i)))
                PutVal(i,i,1.);
        }
    }
    
}